

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

bool Fixpp::
     tryGet<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
               (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                *message,UnderlyingType *value)

{
  bool bVar1;
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *this;
  Type local_40;
  UnderlyingType *local_20;
  UnderlyingType *value_local;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *message_local;
  
  local_20 = value;
  value_local = (UnderlyingType *)message;
  bVar1 = std::bitset<2UL>::test
                    (&(message->
                      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                      ).allBits,0);
  if (bVar1) {
    this = meta::
           get<0ul,Fixpp::FieldRef<Fixpp::TagT<372u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<385u,Fixpp::Type::Char>>>
                     ((tuple<Fixpp::FieldRef<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                       *)value_local);
    FieldRef<Fixpp::TagT<372u,Fixpp::Type::String>>::get_abi_cxx11_(&local_40,this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_20,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return bVar1;
}

Assistant:

bool 
    tryGet(const Message& message, typename Tag::Type::UnderlyingType& value)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        static_assert(Index::Valid, "Invalid tag for given message");

        if (!message.allBits.test(static_cast<size_t>(Index::Value)))
            return false;

        value = meta::get<Index::Value>(message.values).get();
        return true;
    }